

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity.cxx
# Opt level: O0

void __thiscall xray_re::cse_alife_human_abstract::state_write(cse_alife_human_abstract *this)

{
  xr_packet *in_RSI;
  
  state_write((cse_alife_human_abstract *)&this[-1].super_cse_alife_monster_abstract.m_next_graph_id
              ,in_RSI);
  return;
}

Assistant:

void cse_alife_human_abstract::state_write(xr_packet& packet)
{
	cse_alife_trader_abstract::state_write(packet);
	cse_alife_monster_abstract::state_write(packet);
	if (m_version < CSE_VERSION_0x6e) {
		packet.w_u32(0);	// m_tpPath
		packet.w_u32(0);	// m_baVisitedVertices
		packet.w_sz("");	// m_caKnownCustomers
	}
	if (m_version < CSE_VERSION_0x76)
		packet.w_u32(0);	// m_tpKnownCustomers
	if (!packet.is_ini()) {
		packet.w_size_u32(m_equipment_preferences.size());
		packet.w_seq(m_equipment_preferences);
		packet.w_size_u32(m_main_weapon_preferences.size());
		packet.w_seq(m_main_weapon_preferences);
	}
	if (m_version >= CSE_VERSION_0x6e && m_version < 0x70)
		packet.w_u16(m_smart_terrain_id);
}